

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::operator()(Cloner<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
             *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *s,
            Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *t)

{
  char *pcVar1;
  Node *pNVar2;
  Node *pNVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  
  uVar5 = t->mMask + 1;
  if (uVar5 < 0x28f5c28f5c28f5d) {
    uVar6 = (uVar5 * 0x50) / 100;
  }
  else {
    uVar6 = (uVar5 / 100) * 0x50;
  }
  uVar10 = 0xff;
  if (uVar6 < 0xff) {
    uVar10 = uVar6;
  }
  lVar9 = uVar10 + uVar5;
  if (lVar9 + 8U != 0) {
    memmove(t->mInfo,s->mInfo,lVar9 + 8U);
  }
  if (lVar9 != 0) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (t->mInfo[lVar8] != '\0') {
        pNVar2 = t->mKeyVals;
        pNVar3 = s->mKeyVals;
        pcVar1 = (pNVar2->mData).field_2._M_local_buf + lVar7;
        *(char **)(pcVar1 + -0x10) = pcVar1;
        lVar4 = *(long *)((long)&(pNVar3->mData)._M_dataplus._M_p + lVar7);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)((long)&(pNVar2->mData)._M_dataplus._M_p + lVar7),lVar4,
                   *(long *)((long)&(pNVar3->mData)._M_string_length + lVar7) + lVar4);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (lVar9 != lVar8);
  }
  return;
}

Assistant:

void operator()(M const& s, M& t) const {
            auto const numElementsWithBuffer = t.calcNumElementsWithBuffer(t.mMask + 1);
            std::copy(s.mInfo, s.mInfo + t.calcNumBytesInfo(numElementsWithBuffer), t.mInfo);

            for (size_t i = 0; i < numElementsWithBuffer; ++i) {
                if (t.mInfo[i]) {
                    ::new (static_cast<void*>(t.mKeyVals + i)) Node(t, *s.mKeyVals[i]);
                }
            }
        }